

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_expression_lhs.hpp
# Opt level: O3

ResultBuilder * __thiscall
Catch::ExpressionLhs<unsigned_long_const&>::
captureExpression<(Catch::Internal::Operator)0,unsigned_int>
          (ExpressionLhs<unsigned_long_const&> *this,uint *rhs)

{
  ResultBuilder *pRVar1;
  Catch *this_00;
  OfType OVar2;
  unsigned_long in_RDX;
  unsigned_long value;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  string local_58;
  string local_38;
  
  pRVar1 = *(ResultBuilder **)this;
  this_00 = (Catch *)**(undefined8 **)(this + 8);
  OVar2 = ExpressionFailed;
  if (this_00 == (Catch *)(ulong)*rhs) {
    OVar2 = Ok;
  }
  (pRVar1->m_data).resultType = OVar2;
  Catch::toString_abi_cxx11_(&local_38,this_00,in_RDX);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).lhs);
  Catch::toString_abi_cxx11_(&local_58,(Catch *)(ulong)*rhs,value);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).rhs);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"==","");
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).op);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }